

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

ConditionalStatementSyntax * __thiscall
slang::parsing::Parser::parseConditionalStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes,Token uniqueOrPriority)

{
  Token closeParen_00;
  ExpressionSyntax *first;
  ConditionalPredicateSyntax *predicate;
  StatementSyntax *statement;
  ElseClauseSyntax *elseClause;
  ConditionalStatementSyntax *pCVar1;
  Token *this_00;
  undefined8 uVar2;
  StatementSyntax *syntax;
  size_t sVar3;
  char *pcVar4;
  Token prevToken;
  Token ifKeyword;
  Token openParen;
  string_view syntaxName;
  Token closeParen;
  Token local_78;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  ifKeyword = ParserBase::expect(&this->super_ParserBase,IfKeyword);
  openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  this_00 = &local_78;
  Token::Token(this_00);
  first = parseExpression(this);
  predicate = parseConditionalPredicate(this,first,CloseParenthesis,this_00);
  statement = parseStatement(this,true,false);
  elseClause = parseElseClause(this);
  if (elseClause == (ElseClauseSyntax *)0x0) {
    pcVar4 = "if statement";
    sVar3 = 0xc;
    uVar2 = local_78._0_8_;
    syntax = statement;
  }
  else {
    uVar2._0_2_ = (elseClause->elseKeyword).kind;
    uVar2._2_1_ = (elseClause->elseKeyword).field_0x2;
    uVar2._3_1_ = (elseClause->elseKeyword).numFlags.raw;
    uVar2._4_4_ = (elseClause->elseKeyword).rawLen;
    pcVar4 = "else clause";
    sVar3 = 0xb;
    syntax = (StatementSyntax *)(elseClause->clause).ptr;
  }
  prevToken.info = (Info *)this_00;
  prevToken.kind = (TokenKind)uVar2;
  prevToken._2_1_ = SUB81(uVar2,2);
  prevToken.numFlags.raw = SUB81(uVar2,3);
  prevToken.rawLen = SUB84(uVar2,4);
  syntaxName._M_str = pcVar4;
  syntaxName._M_len = sVar3;
  checkEmptyBody(this,&syntax->super_SyntaxNode,prevToken,syntaxName);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0062f0b8;
  closeParen_00.info = local_78.info;
  closeParen_00.kind = local_78.kind;
  closeParen_00._2_1_ = local_78._2_1_;
  closeParen_00.numFlags.raw = local_78.numFlags.raw;
  closeParen_00.rawLen = local_78.rawLen;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  pCVar1 = slang::syntax::SyntaxFactory::conditionalStatement
                     (&this->factory,label,&local_68,uniqueOrPriority,ifKeyword,openParen,predicate,
                      closeParen_00,statement,elseClause);
  return pCVar1;
}

Assistant:

ConditionalStatementSyntax& Parser::parseConditionalStatement(NamedLabelSyntax* label,
                                                              AttrList attributes,
                                                              Token uniqueOrPriority) {
    auto ifKeyword = expect(TokenKind::IfKeyword);
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token closeParen;
    auto& predicate = parseConditionalPredicate(parseExpression(), TokenKind::CloseParenthesis,
                                                closeParen);
    auto& statement = parseStatement();
    auto elseClause = parseElseClause();

    if (elseClause)
        checkEmptyBody(*elseClause->clause, elseClause->elseKeyword, "else clause"sv);
    else
        checkEmptyBody(statement, closeParen, "if statement"sv);

    return factory.conditionalStatement(label, attributes, uniqueOrPriority, ifKeyword, openParen,
                                        predicate, closeParen, statement, elseClause);
}